

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O3

int __thiscall Widget_Browser::item_width(Widget_Browser *this,void *v)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  double dVar7;
  double extraout_XMM0_Qa;
  char buf [340];
  char local_188 [344];
  
  if (*(char *)((long)v + 0x43) == '\0') {
    return 0;
  }
  iVar5 = *(int *)((long)v + 0x48) * 0xc + 0x22;
  iVar2 = (**(code **)(*v + 0xb8))(v);
  if ((iVar2 == 0) && (iVar2 = (**(code **)(*v + 0x130))(v), iVar2 == 0)) {
    pcVar3 = (char *)(**(code **)(*v + 0x20))(v);
    uVar6 = 0;
    copy_trunc(local_188,pcVar3,0x37,0);
    uVar1 = (this->super_Fl_Browser_).textfont_;
    iVar2 = (**(code **)(*v + 0x118))(v);
    if (iVar2 == 0) {
      uVar6 = 1;
    }
    else if (*(int *)((long)v + 0x48) != 0) {
      iVar2 = (**(code **)(**(long **)((long)v + 0x38) + 0x130))();
      uVar6 = (uint)(iVar2 == 0);
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
              (fl_graphics_driver,(ulong)(uVar6 | uVar1),
               (ulong)(uint)(this->super_Fl_Browser_).textsize_);
    pcVar3 = local_188;
  }
  else {
    pcVar3 = (char *)(**(code **)(*v + 0x28))(v);
    if ((*pcVar3 == 'F') && (pcVar3[1] == 'l')) {
      lVar4 = (ulong)(pcVar3[2] == '_') * 3;
    }
    else {
      lVar4 = 0;
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
              (fl_graphics_driver,(ulong)(uint)(this->super_Fl_Browser_).textfont_,
               (ulong)(uint)(this->super_Fl_Browser_).textsize_);
    dVar7 = fl_width(pcVar3 + lVar4);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x38])(fl_graphics_driver,0x6e);
    iVar5 = iVar5 + (int)(extraout_XMM0_Qa + dVar7);
    pcVar3 = *(char **)((long)v + 8);
    if (pcVar3 == (char *)0x0) {
      if (*(char **)((long)v + 0x10) == (char *)0x0) {
        return iVar5;
      }
      pcVar3 = local_188;
      copy_trunc(pcVar3,*(char **)((long)v + 0x10),0x14,1);
    }
    else {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
                (fl_graphics_driver,(ulong)((this->super_Fl_Browser_).textfont_ | 1),
                 (ulong)(uint)(this->super_Fl_Browser_).textsize_);
    }
  }
  dVar7 = fl_width(pcVar3);
  return iVar5 + (int)dVar7;
}

Assistant:

int Widget_Browser::item_width(void *v) const {

  char buf[340]; // edit buffer: large enough to hold 80 UTF-8 chars + nul

  Fl_Type *l = (Fl_Type *)v;

  if (!l->visible) return 0;

  int W = 3 + 13 + 18 + l->level * 12;

  if (l->is_widget() || l->is_class()) {
    const char* c = l->type_name();
    if (!strncmp(c,"Fl_",3)) c += 3;
    fl_font(textfont(), textsize());
    W += int(fl_width(c) + fl_width('n'));
    c = l->name();
    if (c) {
      fl_font(textfont()|FL_BOLD, textsize());
      W += int(fl_width(c));
    } else if (l->label()) {
      copy_trunc(buf, l->label(), 20, 1); // quoted string
      W += int(fl_width(buf));
    }
  } else {
    copy_trunc(buf, l->title(), 55, 0);
    fl_font(textfont() | (l->is_code_block() && (l->level==0 || l->parent->is_class())?0:FL_BOLD), textsize());
    W += int(fl_width(buf));
  }

  return W;
}